

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *param_2)

{
  TestCaseInfo *this_00;
  XmlFormatting fmt;
  XmlWriter *this_01;
  pointer pTVar1;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  pointer local_88;
  ScopedElement sourceTag;
  ScopedElement outerTag;
  string local_60;
  ScopedElement innerTag;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"MatchingTests",(allocator<char> *)&local_60);
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&outerTag,(string *)this_01,(XmlFormatting)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_88 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar1 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar1 != local_88; pTVar1 = pTVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"TestCase",(allocator<char> *)&local_60);
    fmt = (XmlFormatting)&local_a8;
    XmlWriter::scopedElement((XmlWriter *)&innerTag,(string *)this_01,fmt);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = pTVar1->m_info;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Name",(allocator<char> *)&local_60);
    XmlWriter::startElement(this_01,&local_a8,Indent);
    XmlWriter::writeText(this_01,&this_00->name,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"ClassName",(allocator<char> *)&local_60);
    XmlWriter::startElement(this_01,&local_a8,Indent);
    XmlWriter::writeText(this_01,&this_00->className,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Tags",(allocator<char> *)&sourceTag);
    XmlWriter::startElement(this_01,&local_a8,Indent);
    TestCaseInfo::tagsAsString_abi_cxx11_(&local_60,this_00);
    XmlWriter::writeText(this_01,&local_60,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"SourceInfo",(allocator<char> *)&local_60);
    XmlWriter::scopedElement((XmlWriter *)&sourceTag,(string *)this_01,fmt);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"File",&local_aa);
    XmlWriter::startElement(this_01,&local_a8,Indent);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,(this_00->lineInfo).file,&local_a9);
    XmlWriter::writeText(this_01,&local_60,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Line",&local_aa);
    XmlWriter::startElement(this_01,&local_a8,Indent);
    std::__cxx11::to_string(&local_60,(this_00->lineInfo).line);
    XmlWriter::writeText(this_01,&local_60,None);
    XmlWriter::endElement(this_01,Newline);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    XmlWriter::ScopedElement::~ScopedElement(&sourceTag);
    XmlWriter::ScopedElement::~ScopedElement(&innerTag);
  }
  XmlWriter::ScopedElement::~ScopedElement(&outerTag);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const &test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const &testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(testInfo.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                .writeText(testInfo.className, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }